

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O2

cJSON * get_item_from_pointer(cJSON *object,char *pointer,cJSON_bool case_sensitive)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  cJSON_bool cVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  long in_FS_OFFSET;
  bool bVar12;
  size_t local_40;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  if (pointer == (char *)0x0) {
LAB_00101605:
    object = (cJSON *)0x0;
  }
  else {
    bVar3 = *pointer;
    while ((object != (cJSON *)0x0 && (bVar3 == 0x2f))) {
      pointer = (char *)((byte *)pointer + 1);
      iVar4 = cJSON_IsArray(object);
      if (iVar4 == 0) {
        iVar4 = cJSON_IsObject(object);
        if (iVar4 == 0) goto LAB_00101605;
        object = (cJSON *)&object->child;
LAB_00101540:
        do {
          do {
            object = object->next;
            if (object == (cJSON *)0x0) {
              object = (cJSON *)0x0;
              goto LAB_001015ef;
            }
            pbVar9 = (byte *)object->string;
            pbVar11 = (byte *)pointer;
          } while (pbVar9 == (byte *)0x0);
          while( true ) {
            bVar3 = *pbVar9;
            uVar10 = (ulong)bVar3;
            bVar2 = *pbVar11;
            uVar8 = (ulong)bVar2;
            if (uVar10 == 0) break;
            if (uVar8 == 0x7e) {
              pbVar1 = pbVar11 + 1;
              pbVar11 = pbVar11 + 1;
              if (((bVar3 != 0x7e) || (*pbVar1 != 0x30)) && ((bVar3 != 0x2f || (*pbVar1 != 0x31))))
              goto LAB_00101540;
            }
            else {
              if ((bVar2 == 0) || (bVar2 == 0x2f)) break;
              if (case_sensitive == 0) {
                pp_Var7 = __ctype_tolower_loc();
                if ((*pp_Var7)[uVar10] != (*pp_Var7)[uVar8]) goto LAB_00101540;
              }
              else if (bVar3 != bVar2) goto LAB_00101540;
            }
            pbVar9 = pbVar9 + 1;
            pbVar11 = pbVar11 + 1;
          }
        } while ((uVar8 == 0x2f || uVar8 == 0) != (uVar10 == 0));
      }
      else {
        local_40 = 0;
        cVar5 = decode_array_index_from_pointer((uchar *)pointer,&local_40);
        if (cVar5 == 0) goto LAB_00101605;
        object = (cJSON *)&object->child;
        sVar6 = local_40;
        do {
          object = object->next;
          bVar12 = sVar6 != 0;
          sVar6 = sVar6 - 1;
          if (object == (cJSON *)0x0) break;
        } while (bVar12);
      }
LAB_001015ef:
      for (; (bVar3 = *pointer, bVar3 != 0 && (bVar3 != 0x2f));
          pointer = (char *)((byte *)pointer + 1)) {
      }
    }
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != index) {
    __stack_chk_fail();
  }
  return object;
}

Assistant:

static cJSON *get_item_from_pointer(cJSON * const object, const char * pointer, const cJSON_bool case_sensitive)
{
    cJSON *current_element = object;

    if (pointer == NULL)
    {
        return NULL;
    }

    /* follow path of the pointer */
    while ((pointer[0] == '/') && (current_element != NULL))
    {
        pointer++;
        if (cJSON_IsArray(current_element))
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer((const unsigned char*)pointer, &index))
            {
                return NULL;
            }

            current_element = get_array_item(current_element, index);
        }
        else if (cJSON_IsObject(current_element))
        {
            current_element = current_element->child;
            /* GetObjectItem. */
            while ((current_element != NULL) && !compare_pointers((unsigned char*)current_element->string, (const unsigned char*)pointer, case_sensitive))
            {
                current_element = current_element->next;
            }
        }
        else
        {
            return NULL;
        }

        /* skip to the next path token or end of string */
        while ((pointer[0] != '\0') && (pointer[0] != '/'))
        {
            pointer++;
        }
    }

    return current_element;
}